

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

BOOL __thiscall
Memory::Recycler::TryFinishConcurrentCollect<(Memory::CollectionFlags)270635011>(Recycler *this)

{
  size_t *psVar1;
  uint uVar2;
  undefined4 *puVar3;
  ulong uVar4;
  code *pcVar5;
  bool bVar6;
  DWORD DVar7;
  BOOL BVar8;
  DWORD DVar9;
  undefined8 *in_FS_OFFSET;
  
  if ((this->collectionState).value == CollectionStateNotCollecting) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x122b,"(this->CollectionInProgress())","this->CollectionInProgress()");
    if (!bVar6) goto LAB_0029ee56;
    *puVar3 = 0;
  }
  psVar1 = &(this->collectionStats).finishCollectTryCount;
  *psVar1 = *psVar1 + 1;
  SetupPostCollectionFlags<(Memory::CollectionFlags)270635011>(this);
  if (((this->enableConcurrentMark == false) && (this->enableParallelMark == false)) &&
     (this->enableConcurrentSweep == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1233,"(this->IsConcurrentEnabled())","this->IsConcurrentEnabled()");
    if (!bVar6) goto LAB_0029ee56;
    *puVar3 = 0;
  }
  if ((((this->collectionState).value & Collection_Concurrent) == CollectionStateNotCollecting) &&
     (this->isCollectionDisabled == false)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)*in_FS_OFFSET;
    *puVar3 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1234,"(IsConcurrentState() || IsCollectionDisabled())",
                       "IsConcurrentState() || IsCollectionDisabled()");
    if (!bVar6) {
LAB_0029ee56:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar3 = 0;
  }
  if (this->concurrentThread != (HANDLE)0x0) {
    if (((this->collectionState).value & Collection_ExecutingConcurrent) ==
        CollectionStateNotCollecting) {
      DVar7 = GetTickCount();
      if (this->tickCountNextFinishCollection < DVar7) goto LAB_0029ed5c;
    }
    else if (this->priorityBoost == false) {
      DVar7 = GetTickCount();
      if ((this->autoHeap).uncollectedAllocBytes <=
          RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost) {
        uVar2 = this->tickCountStartConcurrent;
        DVar9 = RecyclerHeuristic::PriorityBoostTimeout(this->recyclerFlagsTable);
        if (DVar7 - uVar2 <= DVar9) goto LAB_0029ee42;
      }
      bVar6 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
      if (bVar6) {
        Output::Print(L"%04X> RC(%p): %s: ",this->mainThreadId,this,L"Set priority normal");
        uVar4 = (this->autoHeap).uncollectedAllocBytes;
        if (RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost < uVar4) {
          Output::Print(L"AllocBytes=%d (Time=%d)\n",uVar4,
                        (ulong)(DVar7 - this->tickCountStartConcurrent));
        }
        else {
          Output::Print(L"Time=%d (AllocBytes=%d\n");
        }
      }
      this->priorityBoost = true;
      SetThreadPriority(this->concurrentThread,0);
    }
LAB_0029ee42:
    bVar6 = FinishDisposeObjectsWrapped<(Memory::CollectionFlags)270635011>(this);
    return (BOOL)bVar6;
  }
LAB_0029ed5c:
  BVar8 = FinishConcurrentCollectWrapped
                    (this,CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
                          CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|
                          CollectHeuristic_Time|CollectHeuristic_AllocSize);
  return BVar8;
}

Assistant:

BOOL
Recycler::TryFinishConcurrentCollect()
{
    Assert(this->CollectionInProgress());

    RECYCLER_STATS_INC(this, finishCollectTryCount);

    SetupPostCollectionFlags<flags>();
    const BOOL concurrent = flags & CollectMode_Concurrent;
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;

    Assert(this->IsConcurrentEnabled());
    Assert(IsConcurrentState() || IsCollectionDisabled());
    Assert(!concurrent || !forceInThread);
    if (concurrent && concurrentThread != NULL)
    {
        if (IsConcurrentExecutingState())
        {
            if (!this->priorityBoost)
            {
                uint tickCount = GetTickCount();
                if ((autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                    || (tickCount - this->tickCountStartConcurrent > RecyclerHeuristic::PriorityBoostTimeout(this->GetRecyclerFlagsTable())))
                {

    #ifdef RECYCLER_TRACE
                    if (GetRecyclerFlagsTable().Trace.IsEnabled(Js::RecyclerPhase))
                    {
                        Output::Print(_u("%04X> RC(%p): %s: "), this->mainThreadId, this, _u("Set priority normal"));
                        if (autoHeap.uncollectedAllocBytes > RecyclerHeuristic::Instance.UncollectedAllocBytesConcurrentPriorityBoost)
                        {
                            Output::Print(_u("AllocBytes=%d (Time=%d)\n"), autoHeap.uncollectedAllocBytes, tickCount - this->tickCountStartConcurrent);
                        }
                        else
                        {
                            Output::Print(_u("Time=%d (AllocBytes=%d\n"), tickCount - this->tickCountStartConcurrent, autoHeap.uncollectedAllocBytes);
                        }
                    }
    #endif
                    // Set it to a large number so we don't set the thread priority again
                    this->priorityBoost = true;

                    // The recycler thread hasn't come back in 5 seconds
                    // It either has a large object graph, or it is starving.
                    // Set the priority back to normal
                    SetThreadPriority(this->concurrentThread, THREAD_PRIORITY_NORMAL);
                }
            }

            return FinishDisposeObjectsWrapped<flags>();
        }
        else if ((flags & CollectOverride_FinishConcurrentTimeout) != 0)
        {
            uint tickCount = GetTickCount();

            // If we haven't gone past the time to call finish collection,
            // simply call FinishDisposeObjects and return
            // Otherwise, actually go ahead and call FinishConcurrentCollectWrapped
            // We do this only if this is a collection that allows finish concurrent to timeout
            // If not, by default, we finish the collection
            if (tickCount <= this->tickCountNextFinishCollection)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
    }

    return FinishConcurrentCollectWrapped(flags);
}